

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
fasttext::FastText::getNN
          (vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,FastText *this,Matrix *wordVectors,Vector *query,int32_t k,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *banSet)

{
  pointer pcVar1;
  __normal_iterator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __first;
  bool bVar2;
  int32_t iVar3;
  ulong uVar4;
  const_iterator cVar5;
  long lVar6;
  ulong uVar7;
  pointer ppVar8;
  long lVar9;
  __normal_iterator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  _Var10;
  undefined1 auVar11 [16];
  real rVar12;
  undefined1 auVar13 [64];
  string word;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  char local_88 [16];
  Matrix *local_78;
  Vector *local_70;
  string local_68;
  undefined1 local_48 [16];
  undefined1 extraout_var [60];
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78 = wordVectors;
  local_70 = query;
  auVar13._0_4_ = Vector::norm(query);
  auVar13._4_60_ = extraout_var;
  auVar11._8_4_ = 0x7fffffff;
  auVar11._0_8_ = 0x7fffffff7fffffff;
  auVar11._12_4_ = 0x7fffffff;
  auVar11 = vandps_avx512vl(auVar13._0_16_,auVar11);
  bVar2 = auVar11._0_4_ < 1e-08;
  uVar4 = (ulong)k;
  lVar9 = 0;
  local_48 = ZEXT416((uint)bVar2 * 0x3f800000 + (uint)!bVar2 * (int)auVar13._0_4_);
  while( true ) {
    iVar3 = Dictionary::nwords((this->dict_).
                               super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
    if (iVar3 <= lVar9) break;
    Dictionary::getWord_abi_cxx11_
              (&local_68,
               (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(int32_t)lVar9);
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&banSet->_M_t,&local_68);
    if ((_Rb_tree_header *)cVar5._M_node == &(banSet->_M_t)._M_impl.super__Rb_tree_header) {
      rVar12 = Matrix::dotRow(local_78,local_70,lVar9);
      ppVar8 = (__return_storage_ptr__->
               super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((((long)(__return_storage_ptr__->
                  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar8 >> 3) *
           -0x3333333333333333 - uVar4 != 0) || (ppVar8->first <= rVar12 / (float)local_48._0_4_)) {
        local_98._M_p = local_88;
        local_a0._0_4_ = rVar12 / (float)local_48._0_4_;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,local_68._M_dataplus._M_p,
                   local_68._M_dataplus._M_p + local_68._M_string_length);
        std::
        vector<std::pair<float,std::__cxx11::string>,std::allocator<std::pair<float,std::__cxx11::string>>>
        ::emplace_back<std::pair<float,std::__cxx11::string>>
                  ((vector<std::pair<float,std::__cxx11::string>,std::allocator<std::pair<float,std::__cxx11::string>>>
                    *)__return_storage_ptr__,
                   (pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_a0);
        if (local_98._M_p != local_88) {
          operator_delete(local_98._M_p);
        }
        std::
        push_heap<__gnu_cxx::__normal_iterator<std::pair<float,std::__cxx11::string>*,std::vector<std::pair<float,std::__cxx11::string>,std::allocator<std::pair<float,std::__cxx11::string>>>>,bool(*)(std::pair<float,std::__cxx11::string>const&,std::pair<float,std::__cxx11::string>const&)>
                  ((__return_storage_ptr__->
                   super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
                   (__return_storage_ptr__->
                   super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish,comparePairs);
        ppVar8 = (__return_storage_ptr__->
                 super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        _Var10._M_current =
             (__return_storage_ptr__->
             super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        lVar6 = (long)ppVar8 - (long)_Var10._M_current;
        uVar7 = (lVar6 >> 3) * -0x3333333333333333;
        if (uVar4 <= uVar7 && uVar7 - uVar4 != 0) {
          if (0x28 < lVar6) {
            local_a0 = (undefined1  [8])comparePairs;
            std::
            __pop_heap<__gnu_cxx::__normal_iterator<std::pair<float,std::__cxx11::string>*,std::vector<std::pair<float,std::__cxx11::string>,std::allocator<std::pair<float,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<float,std::__cxx11::string>const&,std::pair<float,std::__cxx11::string>const&)>>
                      (_Var10,ppVar8 + -1,ppVar8 + -1,
                       (_Iter_comp_iter<bool_(*)(const_std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
                        *)local_a0);
            ppVar8 = (__return_storage_ptr__->
                     super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          }
          (__return_storage_ptr__->
          super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = ppVar8 + -1;
          pcVar1 = ppVar8[-1].second._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar1 != &ppVar8[-1].second.field_2) {
            operator_delete(pcVar1);
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    lVar9 = lVar9 + 1;
  }
  _Var10._M_current =
       (__return_storage_ptr__->
       super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  __first._M_current =
       (__return_storage_ptr__->
       super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)_Var10._M_current - (long)__first._M_current;
  local_a0 = (undefined1  [8])comparePairs;
  if (0x28 < lVar9) {
    do {
      _Var10._M_current = _Var10._M_current + -1;
      std::
      __pop_heap<__gnu_cxx::__normal_iterator<std::pair<float,std::__cxx11::string>*,std::vector<std::pair<float,std::__cxx11::string>,std::allocator<std::pair<float,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<float,std::__cxx11::string>const&,std::pair<float,std::__cxx11::string>const&)>>
                (__first,_Var10,_Var10,
                 (_Iter_comp_iter<bool_(*)(const_std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
                  *)local_a0);
      lVar9 = lVar9 + -0x28;
    } while (0x28 < lVar9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<real, std::string>> FastText::getNN(
		const Matrix& wordVectors,
		const Vector& query,
		int32_t k,
		const std::set<std::string>& banSet) {
	std::vector<std::pair<real, std::string>> heap;

	real queryNorm = query.norm();
	if (std::abs(queryNorm) < 1e-8) {
		queryNorm = 1;
	}

	for (int32_t i = 0; i < dict_->nwords(); i++) {
		std::string word = dict_->getWord(i);
		if (banSet.find(word) == banSet.end()) {
			real dp = wordVectors.dotRow(query, i);
			real similarity = dp / queryNorm;

			if (heap.size() == k && similarity < heap.front().first) {
				continue;
			}
			heap.push_back(std::make_pair(similarity, word));
			std::push_heap(heap.begin(), heap.end(), comparePairs);
			if (heap.size() > k) {
				std::pop_heap(heap.begin(), heap.end(), comparePairs);
				heap.pop_back();
			}
		}
	}
	std::sort_heap(heap.begin(), heap.end(), comparePairs);

	return heap;
}